

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholdingValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)560>(Result *__return_storage_ptr__,Model *format)

{
  undefined8 interface_00;
  bool bVar1;
  int32_t modelVersion;
  uint uVar2;
  ClassConfidenceThresholding *this;
  RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *other;
  PrecisionRecallCurve *pPVar3;
  FloatVector *pFVar4;
  RepeatedField<float> *pRVar5;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  float local_1fc;
  const_iterator pfStack_1f8;
  float elt_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  RepeatedField<float> *__range3_3;
  string local_1d8;
  float local_1b4;
  const_iterator pfStack_1b0;
  float elt_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  RepeatedField<float> *__range3_2;
  string local_190;
  float local_16c;
  const_iterator pfStack_168;
  float elt_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  RepeatedField<float> *__range3_1;
  string local_148;
  float local_124;
  const_iterator pfStack_120;
  float elt;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedField<float> *__range3;
  string local_100;
  int local_dc;
  int local_d8;
  int recallthreshElts;
  int recallvaluesElts;
  int local_b0;
  int local_ac;
  int precisionthreshElts;
  int precisionvaluesElts;
  int i;
  int nCurves;
  RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> precisionrecallcurves;
  ValidationPolicy local_80 [4];
  Result local_70;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *interface;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = Specification::Model::description(format);
  Result::Result((Result *)local_48);
  interface_00 = result.m_message.field_2._8_8_;
  modelVersion = Specification::Model::specificationversion(format);
  ValidationPolicy::ValidationPolicy(local_80);
  validateModelDescription(&local_70,(ModelDescription *)interface_00,modelVersion,local_80);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    this = Specification::Model::classconfidencethresholding(format);
    other = Specification::ClassConfidenceThresholding::precisionrecallcurves(this);
    google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
    RepeatedPtrField((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i,other);
    precisionvaluesElts =
         google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::size
                   ((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i);
    if (precisionvaluesElts < 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,
                 "The ClassConfidenceThresholding model has no precisionRecallCurves.",&local_249);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
    }
    else {
      for (precisionthreshElts = 0; precisionthreshElts < precisionvaluesElts;
          precisionthreshElts = precisionthreshElts + 1) {
        pPVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
                 Get((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i,
                     precisionthreshElts);
        pFVar4 = Specification::PrecisionRecallCurve::precisionvalues(pPVar3);
        pRVar5 = Specification::FloatVector::vector(pFVar4);
        local_ac = google::protobuf::RepeatedField<float>::size(pRVar5);
        pPVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
                 Get((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i,
                     precisionthreshElts);
        pFVar4 = Specification::PrecisionRecallCurve::precisionconfidencethresholds(pPVar3);
        pRVar5 = Specification::FloatVector::vector(pFVar4);
        local_b0 = google::protobuf::RepeatedField<float>::size(pRVar5);
        if ((local_ac == 0) || (local_ac != local_b0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&recallvaluesElts,
                     "Zero length or mismatched precisionRecallCurves components",
                     (allocator<char> *)((long)&recallthreshElts + 3));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&recallvaluesElts
                        );
          std::__cxx11::string::~string((string *)&recallvaluesElts);
          std::allocator<char>::~allocator((allocator<char> *)((long)&recallthreshElts + 3));
          goto LAB_00426085;
        }
        pPVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
                 Get((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i,
                     precisionthreshElts);
        pFVar4 = Specification::PrecisionRecallCurve::recallvalues(pPVar3);
        pRVar5 = Specification::FloatVector::vector(pFVar4);
        local_d8 = google::protobuf::RepeatedField<float>::size(pRVar5);
        pPVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
                 Get((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i,
                     precisionthreshElts);
        pFVar4 = Specification::PrecisionRecallCurve::recallconfidencethresholds(pPVar3);
        pRVar5 = Specification::FloatVector::vector(pFVar4);
        local_dc = google::protobuf::RepeatedField<float>::size(pRVar5);
        if ((local_d8 == 0) || (local_d8 != local_dc)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,
                     "Zero length or mismatched precisionRecallCurves components",
                     (allocator<char> *)((long)&__range3 + 7));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
          goto LAB_00426085;
        }
        pPVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
                 Get((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i,
                     precisionthreshElts);
        pFVar4 = Specification::PrecisionRecallCurve::precisionvalues(pPVar3);
        __begin3 = (const_iterator)Specification::FloatVector::vector(pFVar4);
        __end3 = google::protobuf::RepeatedField<float>::begin((RepeatedField<float> *)__begin3);
        pfStack_120 = google::protobuf::RepeatedField<float>::end((RepeatedField<float> *)__begin3);
        for (; __end3 != pfStack_120; __end3 = __end3 + 1) {
          local_124 = *__end3;
          uVar2 = std::isinf((double)(ulong)(uint)local_124);
          if ((uVar2 & 1) != 0) {
LAB_0042598d:
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,
                       "An element of precisionvalues is not a positive number or zero.",
                       (allocator<char> *)((long)&__range3_1 + 7));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
            goto LAB_00426085;
          }
          uVar2 = std::isnan((double)(ulong)(uint)local_124);
          if (((uVar2 & 1) != 0) || (local_124 < 0.0)) goto LAB_0042598d;
        }
        pPVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
                 Get((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i,
                     precisionthreshElts);
        pFVar4 = Specification::PrecisionRecallCurve::precisionconfidencethresholds(pPVar3);
        __begin3_1 = (const_iterator)Specification::FloatVector::vector(pFVar4);
        __end3_1 = google::protobuf::RepeatedField<float>::begin((RepeatedField<float> *)__begin3_1)
        ;
        pfStack_168 = google::protobuf::RepeatedField<float>::end
                                ((RepeatedField<float> *)__begin3_1);
        for (; __end3_1 != pfStack_168; __end3_1 = __end3_1 + 1) {
          local_16c = *__end3_1;
          uVar2 = std::isinf((double)(ulong)(uint)local_16c);
          if ((uVar2 & 1) != 0) {
LAB_00425b5c:
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_190,
                       "An element of precisionconfidencethresholds is not a positive number or zero."
                       ,(allocator<char> *)((long)&__range3_2 + 7));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_2 + 7));
            goto LAB_00426085;
          }
          uVar2 = std::isnan((double)(ulong)(uint)local_16c);
          if (((uVar2 & 1) != 0) || (local_16c < 0.0)) goto LAB_00425b5c;
        }
        pPVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
                 Get((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i,
                     precisionthreshElts);
        pFVar4 = Specification::PrecisionRecallCurve::recallvalues(pPVar3);
        __begin3_2 = (const_iterator)Specification::FloatVector::vector(pFVar4);
        __end3_2 = google::protobuf::RepeatedField<float>::begin((RepeatedField<float> *)__begin3_2)
        ;
        pfStack_1b0 = google::protobuf::RepeatedField<float>::end
                                ((RepeatedField<float> *)__begin3_2);
        for (; __end3_2 != pfStack_1b0; __end3_2 = __end3_2 + 1) {
          local_1b4 = *__end3_2;
          uVar2 = std::isinf((double)(ulong)(uint)local_1b4);
          if ((uVar2 & 1) != 0) {
LAB_00425d2b:
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d8,
                       "An element of recallvalues is not a positive number or zero.",
                       (allocator<char> *)((long)&__range3_3 + 7));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1d8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_3 + 7));
            goto LAB_00426085;
          }
          uVar2 = std::isnan((double)(ulong)(uint)local_1b4);
          if (((uVar2 & 1) != 0) || (local_1b4 < 0.0)) goto LAB_00425d2b;
        }
        pPVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
                 Get((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i,
                     precisionthreshElts);
        pFVar4 = Specification::PrecisionRecallCurve::recallconfidencethresholds(pPVar3);
        __begin3_3 = (const_iterator)Specification::FloatVector::vector(pFVar4);
        __end3_3 = google::protobuf::RepeatedField<float>::begin((RepeatedField<float> *)__begin3_3)
        ;
        pfStack_1f8 = google::protobuf::RepeatedField<float>::end
                                ((RepeatedField<float> *)__begin3_3);
        for (; __end3_3 != pfStack_1f8; __end3_3 = __end3_3 + 1) {
          local_1fc = *__end3_3;
          uVar2 = std::isinf((double)(ulong)(uint)local_1fc);
          if ((uVar2 & 1) != 0) {
LAB_00425efa:
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_220,
                       "An element of recallconfidencethresholds is not a positive number or zero.",
                       &local_221);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::allocator<char>::~allocator(&local_221);
            goto LAB_00426085;
          }
          uVar2 = std::isnan((double)(ulong)(uint)local_1fc);
          if (((uVar2 & 1) != 0) || (local_1fc < 0.0)) goto LAB_00425efa;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
LAB_00426085:
    precisionrecallcurves.super_RepeatedPtrFieldBase.rep_._4_4_ = 1;
    google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
    ~RepeatedPtrField((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&i);
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    precisionrecallcurves.super_RepeatedPtrFieldBase.rep_._4_4_ = 1;
  }
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_classConfidenceThresholding>(const Specification::Model& format) {
        const auto& interface = format.description();
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // validate precisionRecallCurves
        google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> precisionrecallcurves =
                format.classconfidencethresholding().precisionrecallcurves();
        int nCurves = precisionrecallcurves.size();
        if (nCurves > 0) {
            for (int i = 0; i < nCurves; ++i) {
                int precisionvaluesElts = precisionrecallcurves.Get(i).precisionvalues().vector().size();
                int precisionthreshElts = precisionrecallcurves.Get(i).precisionconfidencethresholds().vector().size();
                if (0 == precisionvaluesElts || precisionvaluesElts != precisionthreshElts) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Zero length or mismatched precisionRecallCurves components");
                }
                
                int recallvaluesElts = precisionrecallcurves.Get(i).recallvalues().vector().size();
                int recallthreshElts = precisionrecallcurves.Get(i).recallconfidencethresholds().vector().size();
                if (0 == recallvaluesElts || recallvaluesElts != recallthreshElts) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Zero length or mismatched precisionRecallCurves components");
                }
                            
                for (auto elt : precisionrecallcurves.Get(i).precisionvalues().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of precisionvalues is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).precisionconfidencethresholds().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of precisionconfidencethresholds is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).recallvalues().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of recallvalues is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).recallconfidencethresholds().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of recallconfidencethresholds is not a positive number or zero.");
                    }
                }
            }
            return Result();
        } else {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The ClassConfidenceThresholding model has no precisionRecallCurves.");
        }
    }